

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string local_358;
  undefined1 local_338 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  local_318;
  _Alloc_hider local_2e0;
  char local_2d0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  _Alloc_hider local_298;
  char local_288 [624];
  
  bVar1 = embree::TutorialBenchmark::benchmark(argc,argv);
  if (bVar1) {
    embree::TutorialBenchmark::TutorialBenchmark
              ((TutorialBenchmark *)local_338,embree::renderBenchFunc<embree::Tutorial>);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"subdivision_geometry","");
    iVar2 = embree::TutorialBenchmark::main((TutorialBenchmark *)local_338,argc,argv,&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p);
    }
    local_338._0_8_ = &PTR_postParseCommandLine_002c7fc8;
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c0);
    if (local_2e0._M_p != local_2d0) {
      operator_delete(local_2e0._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
    ::~_Rb_tree(&local_318);
    std::
    vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
    ::~vector((vector<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
               *)(local_338 + 8));
  }
  else {
    embree::Tutorial::Tutorial((Tutorial *)local_338);
    iVar2 = embree::TutorialApplication::main((TutorialApplication *)local_338,argc,argv);
    embree::TutorialApplication::~TutorialApplication((TutorialApplication *)local_338);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if (embree::TutorialBenchmark::benchmark(argc, argv)) {
    return embree::TutorialBenchmark(embree::renderBenchFunc<embree::Tutorial>).main(argc, argv, "subdivision_geometry");
  }
  return embree::Tutorial().main(argc,argv);
}